

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O3

void __thiscall
Clasp::WeightConstraint::addWatch(WeightConstraint *this,Solver *s,uint32 idx,ActiveConstraint c)

{
  if ((*(uint *)&this->field_0x10 >> 0x1c & 3 ^ c) == FTB_BFB) {
    return;
  }
  Solver::addWatch(s,(Literal)((uint)this->lits_[(ulong)(idx << (SUB41(*this->lits_,3) >> 7)) + 1] &
                               0xfffffffe ^ c * 2 ^ 2),&this->super_Constraint,c + idx * 2);
  return;
}

Assistant:

void WeightConstraint::addWatch(Solver& s, uint32 idx, ActiveConstraint c) {
	// Add watch only if c is relevant.
	if (uint32(c^1) != active_) {
		// Use LSB to store the constraint that watches the literal.
		s.addWatch(~lit(idx, c), this, (idx<<1)+c);
	}
}